

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FieldDescriptor::default_value_enum(FieldDescriptor *this)

{
  once_flag *control;
  FieldDescriptor *local_10;
  
  control = this->type_once_;
  if ((control != (once_flag *)0x0) &&
     ((control->control_).super___atomic_base<unsigned_int>._M_i != 0xdd)) {
    local_10 = this;
    absl::lts_20250127::base_internal::
    CallOnceImpl<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (&control->control_,SCHEDULE_COOPERATIVE_AND_KERNEL,TypeOnceInit,&local_10);
  }
  return (EnumValueDescriptor *)(this->field_20).default_value_int64_t_;
}

Assistant:

const EnumValueDescriptor* FieldDescriptor::default_value_enum() const {
  if (type_once_) {
    absl::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
  }
  return default_value_enum_;
}